

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_value_string(jx9_value *pVal,char *zString,int nLen)

{
  sxu32 local_1c;
  int nLen_local;
  char *zString_local;
  jx9_value *pVal_local;
  
  if ((pVal->iFlags & 1U) == 0) {
    jx9MemObjRelease(pVal);
    pVal->iFlags = pVal->iFlags & 0xfffffe90U | 1;
  }
  if (zString != (char *)0x0) {
    local_1c = nLen;
    if (nLen < 0) {
      local_1c = SyStrlen(zString);
    }
    SyBlobAppend(&pVal->sBlob,zString,local_1c);
  }
  return 0;
}

Assistant:

JX9_PRIVATE int jx9_value_string(jx9_value *pVal, const char *zString, int nLen)
{
	if((pVal->iFlags & MEMOBJ_STRING) == 0 ){
		/* Invalidate any prior representation */
		jx9MemObjRelease(pVal);
		MemObjSetType(pVal, MEMOBJ_STRING);
	}
	if( zString ){
		if( nLen < 0 ){
			/* Compute length automatically */
			nLen = (int)SyStrlen(zString);
		}
		SyBlobAppend(&pVal->sBlob, (const void *)zString, (sxu32)nLen);
	}
	return JX9_OK;
}